

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

AttConfig * __thiscall QPDFJob::AttConfig::mimetype(AttConfig *this,string *parameter)

{
  long lVar1;
  allocator<char> local_39;
  string local_38;
  
  lVar1 = std::__cxx11::string::find((char)parameter,0x2f);
  if (lVar1 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"mime type should be specified as type/subtype",&local_39);
    usage(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::__cxx11::string::_M_assign((string *)&(this->att).mimetype);
  return this;
}

Assistant:

QPDFJob::AttConfig*
QPDFJob::AttConfig::mimetype(std::string const& parameter)
{
    if (parameter.find('/') == std::string::npos) {
        usage("mime type should be specified as type/subtype");
    }
    this->att.mimetype = parameter;
    return this;
}